

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.cc
# Opt level: O3

void __thiscall tt::net::HttpData::handleWrite(HttpData *this)

{
  __uint32_t *p_Var1;
  element_type *peVar2;
  ssize_t sVar3;
  
  if ((this->error_ == false) && (this->connectionState_ != H_DISCONNECTED)) {
    peVar2 = (this->channel_).super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    sVar3 = writen(this->fd_,&this->outBuffer_);
    if (sVar3 < 0) {
      perror("writen");
      peVar2->m_events = 0;
      this->error_ = true;
    }
    if ((this->outBuffer_)._M_string_length != 0) {
      p_Var1 = &peVar2->m_events;
      *(byte *)p_Var1 = (byte)*p_Var1 | 4;
    }
  }
  return;
}

Assistant:

void HttpData::handleWrite() {
  if (!error_ && connectionState_ != H_DISCONNECTED) {
    __uint32_t &events_ = channel_->getEvents();
    if (writen(fd_, outBuffer_) < 0) {
      perror("writen");
      events_ = 0;
      error_ = true;
    }
    if (outBuffer_.size() > 0) events_ |= EPOLLOUT;
  }
}